

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O3

int unicode_decomp_entry(uint32_t *res,uint32_t c,int idx,uint32_t code,uint32_t len,uint32_t type)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  ulong uVar4;
  ushort *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  
  uVar4 = (ulong)unicode_decomp_table2[idx];
  if (type == 0) {
    *res = (uint)unicode_decomp_table2[idx];
    return 1;
  }
  uVar7 = 0;
  if (0x21 < type - 1) {
    return 0;
  }
  puVar5 = (ushort *)(unicode_decomp_data + uVar4);
  switch(type) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    uVar7 = 0;
    do {
      uVar2 = *(ushort *)(unicode_decomp_data + uVar7 * 2 + uVar4 + (c - code) * type * 2);
      res[uVar7] = (uint)uVar2;
      if (uVar2 == 0) {
        return 0;
      }
      uVar7 = uVar7 + 1;
    } while (type != uVar7);
    break;
  case 8:
  case 9:
    type = type - 7;
    iVar9 = (c - code) * type;
    uVar8 = iVar9 * 2;
    uVar4 = 0;
    do {
      uVar6 = (*(byte *)((long)puVar5 + (ulong)(((uint)(iVar9 + (int)uVar4) >> 2) + len * type * 2))
               >> ((byte)uVar8 & 6) & 3) << 0x10 | (uint)*(ushort *)((long)puVar5 + (ulong)uVar8);
      if (uVar6 == 0) {
        return 0;
      }
      res[uVar4] = uVar6;
      uVar4 = uVar4 + 1;
      uVar8 = uVar8 + 2;
    } while (type != uVar4);
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    type = type - 9;
    uVar4 = 0;
    do {
      bVar1 = *(byte *)((long)puVar5 + uVar4 + (c - code) * type);
      uVar8 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if (0xcf < bVar1) {
          uVar8 = (uint)*(ushort *)
                         ((long)&unicode_get_short_code_unicode_short_table +
                         (ulong)(bVar1 - 0xd0) * 2);
          goto LAB_00172f2a;
        }
        res[uVar4] = bVar1 + 0x280;
      }
      else {
LAB_00172f2a:
        res[uVar4] = uVar8;
        if (uVar8 == 0) {
          return 0;
        }
      }
      uVar4 = uVar4 + 1;
    } while (type != uVar4);
    break;
  case 0xf:
    uVar8 = 1;
    goto LAB_00172ebf;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    uVar8 = (type - 0x10 >> 1) + 2;
    uVar7 = (ulong)(((type & 1) + 1) - (uint)(type - 0x10 < 2));
LAB_00172ebf:
    uVar4 = 0;
    do {
      iVar9 = 0;
      if (uVar7 == uVar4) {
        iVar9 = c - code;
      }
      res[uVar4] = iVar9 + (uint)puVar5[uVar4];
      uVar4 = uVar4 + 1;
      type = uVar8;
    } while (uVar8 != uVar4);
    break;
  default:
    uVar4 = (ulong)(type - 0x15);
    goto LAB_00172e24;
  case 0x1e:
    uVar4 = 0x12;
LAB_00172e24:
    uVar2 = *puVar5;
    uVar7 = 0;
    do {
      bVar1 = *(byte *)((long)puVar5 + uVar7 + ((c - code) * (uint)uVar4 + 2));
      uVar10 = (uint)bVar1 + (uint)uVar2;
      if (bVar1 == 0xff) {
        uVar10 = 0x20;
      }
      res[uVar7] = uVar10;
      uVar7 = uVar7 + 1;
      type = (uint)uVar4;
    } while (uVar4 != uVar7);
    break;
  case 0x1f:
    uVar7 = (ulong)((c - code) * 3);
    uVar8 = (uint)*(ushort *)((long)puVar5 + uVar7);
    *res = uVar8;
    if (uVar8 == 0) {
      return 0;
    }
    bVar1 = unicode_decomp_data[uVar7 + uVar4 + 2];
    goto LAB_0017307e;
  case 0x20:
    *res = (uint)*puVar5;
    res[2] = (uint)*(ushort *)(unicode_decomp_data + uVar4 + 2);
    res[1] = (uint)*(ushort *)((long)puVar5 + (ulong)((c - code) * 2 + 4));
    type = 3;
    break;
  case 0x21:
  case 0x22:
    uVar8 = c - code;
    if (type == 0x21) {
      bVar1 = *(byte *)((long)puVar5 + (ulong)(uVar8 & 0xfffffffe));
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if (bVar1 < 0xd0) {
          uVar6 = bVar1 + 0x280;
        }
        else {
          uVar6 = (uint)*(ushort *)
                         ((long)&unicode_get_short_code_unicode_short_table +
                         (ulong)(bVar1 - 0xd0) * 2);
        }
      }
      puVar5 = (ushort *)((long)puVar5 + (ulong)(uVar8 & 0xfffffffe) + 1);
    }
    else {
      puVar3 = (ushort *)((ulong)((uVar8 >> 1) * 3) + (long)puVar5);
      puVar5 = puVar3 + 1;
      uVar6 = (uint)*puVar3;
    }
    if ((uVar8 & 1) != 0) {
      iVar9 = 1;
      if (uVar6 - 0x410 < 0x20) {
        iVar9 = 0x20;
      }
      if (uVar6 < 0x100) {
        iVar9 = 0x20;
      }
      uVar6 = iVar9 + uVar6;
    }
    *res = uVar6;
    bVar1 = (byte)*puVar5;
LAB_0017307e:
    uVar8 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xd0) {
        uVar8 = uVar8 + 0x280;
      }
      else {
        uVar8 = (uint)*(ushort *)
                       ((long)&unicode_get_short_code_unicode_short_table +
                       (ulong)(uVar8 - 0xd0) * 2);
      }
    }
    res[1] = uVar8;
    type = 2;
  }
  return type;
}

Assistant:

static int unicode_decomp_entry(uint32_t *res, uint32_t c,
                                int idx, uint32_t code, uint32_t len,
                                uint32_t type)
{
    uint32_t c1;
    int l, i, p;
    const uint8_t *d;

    if (type == DECOMP_TYPE_C1) {
        res[0] = unicode_decomp_table2[idx];
        return 1;
    } else {
        d = unicode_decomp_data + unicode_decomp_table2[idx];
        switch(type) {
        case DECOMP_TYPE_L1:
        case DECOMP_TYPE_L2:
        case DECOMP_TYPE_L3:
        case DECOMP_TYPE_L4:
        case DECOMP_TYPE_L5:
        case DECOMP_TYPE_L6:
        case DECOMP_TYPE_L7:
            l = type - DECOMP_TYPE_L1 + 1;
            d += (c - code) * l * 2;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get16(d + 2 * i)) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_LL1:
        case DECOMP_TYPE_LL2:
            {
                uint32_t k, p;
                l = type - DECOMP_TYPE_LL1 + 1;
                k = (c - code) * l;
                p = len * l * 2;
                for(i = 0; i < l; i++) {
                    c1 = unicode_get16(d + 2 * k) |
                        (((d[p + (k / 4)] >> ((k % 4) * 2)) & 3) << 16);
                    if (!c1)
                        return 0;
                    res[i] = c1;
                    k++;
                }
            }
            return l;
        case DECOMP_TYPE_S1:
        case DECOMP_TYPE_S2:
        case DECOMP_TYPE_S3:
        case DECOMP_TYPE_S4:
        case DECOMP_TYPE_S5:
            l = type - DECOMP_TYPE_S1 + 1;
            d += (c - code) * l;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get_short_code(d[i])) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_I1:
            l = 1;
            p = 0;
            goto decomp_type_i;
        case DECOMP_TYPE_I2_0:
        case DECOMP_TYPE_I2_1:
        case DECOMP_TYPE_I3_1:
        case DECOMP_TYPE_I3_2:
        case DECOMP_TYPE_I4_1:
        case DECOMP_TYPE_I4_2:
            l = 2 + ((type - DECOMP_TYPE_I2_0) >> 1);
            p = ((type - DECOMP_TYPE_I2_0) & 1) + (l > 2);
        decomp_type_i:
            for(i = 0; i < l; i++) {
                c1 = unicode_get16(d + 2 * i);
                if (i == p)
                    c1 += c - code;
                res[i] = c1;
            }
            return l;
        case DECOMP_TYPE_B18:
            l = 18;
            goto decomp_type_b;
        case DECOMP_TYPE_B1:
        case DECOMP_TYPE_B2:
        case DECOMP_TYPE_B3:
        case DECOMP_TYPE_B4:
        case DECOMP_TYPE_B5:
        case DECOMP_TYPE_B6:
        case DECOMP_TYPE_B7:
        case DECOMP_TYPE_B8:
            l = type - DECOMP_TYPE_B1 + 1;
        decomp_type_b:
            {
                uint32_t c_min;
                c_min = unicode_get16(d);
                d += 2 + (c - code) * l;
                for(i = 0; i < l; i++) {
                    c1 = d[i];
                    if (c1 == 0xff)
                        c1 = 0x20;
                    else
                        c1 += c_min;
                    res[i] = c1;
                }
            }
            return l;
        case DECOMP_TYPE_LS2:
            d += (c - code) * 3;
            if (!(res[0] = unicode_get16(d)))
                return 0;
            res[1] = unicode_get_short_code(d[2]);
            return 2;
        case DECOMP_TYPE_PAT3:
            res[0] = unicode_get16(d);
            res[2] = unicode_get16(d + 2);
            d += 4 + (c - code) * 2;
            res[1] = unicode_get16(d);
            return 3;
        case DECOMP_TYPE_S2_UL:
        case DECOMP_TYPE_LS2_UL:
            c1 = c - code;
            if (type == DECOMP_TYPE_S2_UL) {
                d += c1 & ~1;
                c = unicode_get_short_code(*d);
                d++;
            } else {
                d += (c1 >> 1) * 3;
                c = unicode_get16(d);
                d += 2;
            }
            if (c1 & 1)
                c = unicode_get_lower_simple(c);
            res[0] = c;
            res[1] = unicode_get_short_code(*d);
            return 2;
        }
    }
    return 0;
}